

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQClosure::~SQClosure(SQClosure *this)

{
  SQClosure *this_local;
  
  (this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQClosure_00215318;
  if (this->_root != (SQWeakRef *)0x0) {
    (this->_root->super_SQRefCounted)._uiRef = (this->_root->super_SQRefCounted)._uiRef - 1;
    if ((this->_root->super_SQRefCounted)._uiRef == 0) {
      (*(this->_root->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    this->_root = (SQWeakRef *)0x0;
  }
  if (this->_env != (SQWeakRef *)0x0) {
    (this->_env->super_SQRefCounted)._uiRef = (this->_env->super_SQRefCounted)._uiRef - 1;
    if ((this->_env->super_SQRefCounted)._uiRef == 0) {
      (*(this->_env->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
    this->_env = (SQWeakRef *)0x0;
  }
  if (this->_base != (SQClass *)0x0) {
    (this->_base->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->_base->super_SQCollectable).super_SQRefCounted._uiRef - 1;
    if ((this->_base->super_SQCollectable).super_SQRefCounted._uiRef == 0) {
      (*(this->_base->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_base = (SQClass *)0x0;
  }
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQCollectable)._sharedstate)->_gc_chain,(SQCollectable_conflict *)this
              );
  }
  SQCollectable::~SQCollectable(&this->super_SQCollectable);
  return;
}

Assistant:

SQClosure::~SQClosure()
{
    __ObjRelease(_root);
    __ObjRelease(_env);
    __ObjRelease(_base);
    REMOVE_FROM_CHAIN(&_ss(this)->_gc_chain,this);
}